

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void str_sanitize(char *str_in)

{
  byte bVar1;
  byte *pbVar2;
  
  bVar1 = *str_in;
  if (bVar1 != 0) {
    pbVar2 = (byte *)(str_in + 1);
    do {
      if ((bVar1 < 0x20) && ((0xd < bVar1 || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)))) {
        pbVar2[-1] = 0x20;
      }
      bVar1 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar1 != 0);
  }
  return;
}

Assistant:

void str_sanitize(char *str_in)
{
	unsigned char *str = (unsigned char *)str_in;
	while(*str)
	{
		if(*str < 32 && !(*str == '\r') && !(*str == '\n') && !(*str == '\t'))
			*str = ' ';
		str++;
	}
}